

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

bool __thiscall
node::BlockManager::LoadBlockIndexDB(BlockManager *this,optional<uint256> *snapshot_blockhash)

{
  vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *this_00;
  pointer *ppCVar1;
  int iVar2;
  long lVar3;
  iterator __position;
  pointer pCVar4;
  BlockTreeDB *this_01;
  mutex_type *pmVar5;
  bool bVar6;
  bool bVar7;
  _Base_ptr p_Var8;
  uint *puVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  uint uVar13;
  long lVar14;
  _Self __tmp;
  long lVar15;
  _Hash_node_base *p_Var16;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  FlatFilePos pos;
  int max_blockfile_num;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  undefined1 local_88 [32];
  set<int,_std::less<int>,_std::allocator<int>_> setBlkDataFiles;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = LoadBlockIndex(this,snapshot_blockhash);
  if (bVar6) {
    max_blockfile_num = 0;
    CDBWrapper::Read<unsigned_char,int>
              (&((this->m_block_tree_db)._M_t.
                 super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                 .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl)->
                super_CDBWrapper,"l\x01",&max_blockfile_num);
    this_00 = &this->m_blockfile_info;
    std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::resize
              (this_00,(long)max_blockfile_num + 1);
    lVar14 = -1;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x65;
    logging_function._M_str = "LoadBlockIndexDB";
    logging_function._M_len = 0x10;
    LogPrintFormatInternal<char[17],int>
              (logging_function,source_file,0x1fc,ALL,Info,(ConstevalFormatString<2U>)0xfa05c0,
               (char (*) [17])"LoadBlockIndexDB",&max_blockfile_num);
    if (-1 < max_blockfile_num) {
      lVar10 = 0x66;
      lVar15 = 0;
      do {
        setBlkDataFiles._M_t._M_impl._0_8_ = lVar10;
        CDBWrapper::Read<std::pair<unsigned_char,int>,CBlockFileInfo>
                  (&((this->m_block_tree_db)._M_t.
                     super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                     .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl)->
                    super_CDBWrapper,(pair<unsigned_char,_int> *)&setBlkDataFiles,
                   (CBlockFileInfo *)
                   ((long)&((this->m_blockfile_info).
                            super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
                            _M_impl.super__Vector_impl_data._M_start)->nBlocks + lVar15));
        lVar14 = lVar14 + 1;
        lVar15 = lVar15 + 0x28;
        lVar10 = lVar10 + 0x100000000;
      } while (lVar14 < max_blockfile_num);
    }
    CBlockFileInfo::ToString_abi_cxx11_
              ((string *)&setBlkDataFiles,
               (this_00->super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>).
               _M_impl.super__Vector_impl_data._M_start + max_blockfile_num);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_00._M_len = 0x65;
    logging_function_00._M_str = "LoadBlockIndexDB";
    logging_function_00._M_len = 0x10;
    LogPrintFormatInternal<char[17],std::__cxx11::string>
              (logging_function_00,source_file_00,0x200,ALL,Info,(ConstevalFormatString<2U>)0xfa05da
               ,(char (*) [17])"LoadBlockIndexDB",(string *)&setBlkDataFiles);
    if ((_Base_ptr *)setBlkDataFiles._M_t._M_impl._0_8_ !=
        &setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)setBlkDataFiles._M_t._M_impl._0_8_,
                      (ulong)((long)&(setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    iVar2 = max_blockfile_num;
    setBlkDataFiles._M_t._M_impl._0_8_ = 0;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
         0xffffffff00000000);
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    criticalblock9.super_unique_lock._M_device =
         (mutex_type *)((ulong)(max_blockfile_num + 1) << 0x20 | 0x66);
    bVar6 = CDBWrapper::Read<std::pair<unsigned_char,int>,CBlockFileInfo>
                      (&((this->m_block_tree_db)._M_t.
                         super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                         .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl)->
                        super_CDBWrapper,(pair<unsigned_char,_int> *)&criticalblock9,
                       (CBlockFileInfo *)&setBlkDataFiles);
    if (bVar6) {
      uVar13 = iVar2 + 2;
      do {
        __position._M_current =
             (this->m_blockfile_info).
             super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_blockfile_info).
            super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<CBlockFileInfo,std::allocator<CBlockFileInfo>>::
          _M_realloc_insert<CBlockFileInfo_const&>
                    ((vector<CBlockFileInfo,std::allocator<CBlockFileInfo>> *)this_00,__position,
                     (CBlockFileInfo *)&setBlkDataFiles);
        }
        else {
          (__position._M_current)->nTimeLast =
               (uint64_t)setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          *(_Base_ptr *)&(__position._M_current)->nHeightLast =
               setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          (__position._M_current)->nTimeFirst =
               (uint64_t)setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (__position._M_current)->nBlocks = setBlkDataFiles._M_t._M_impl._0_4_;
          (__position._M_current)->nSize = setBlkDataFiles._M_t._M_impl._4_4_;
          (__position._M_current)->nUndoSize =
               setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          (__position._M_current)->nHeightFirst =
               setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
          ppCVar1 = &(this->m_blockfile_info).
                     super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + 1;
        }
        setBlkDataFiles._M_t._M_impl._0_8_ = 0;
        setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             ((ulong)setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
             0xffffffff00000000);
        setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        criticalblock9.super_unique_lock._M_device = (mutex_type *)((ulong)uVar13 << 0x20 | 0x66);
        bVar6 = CDBWrapper::Read<std::pair<unsigned_char,int>,CBlockFileInfo>
                          (&((this->m_block_tree_db)._M_t.
                             super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                             .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl)->
                            super_CDBWrapper,(pair<unsigned_char,_int> *)&criticalblock9,
                           (CBlockFileInfo *)&setBlkDataFiles);
        uVar13 = uVar13 + 1;
      } while (bVar6);
    }
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_01._M_len = 0x65;
    logging_function_01._M_str = "LoadBlockIndexDB";
    logging_function_01._M_len = 0x10;
    LogPrintFormatInternal<>
              (logging_function_01,source_file_01,0x20b,ALL,Info,(ConstevalFormatString<0U>)0xfa05f8
              );
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var16 = (this->m_block_index)._M_h._M_before_begin._M_nxt;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var16 != (_Hash_node_base *)0x0) {
      do {
        if (((ulong)p_Var16[0x10]._M_nxt & 8) != 0) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &setBlkDataFiles,(int *)((long)&p_Var16[8]._M_nxt + 4));
        }
        p_Var16 = p_Var16->_M_nxt;
      } while (p_Var16 != (_Hash_node_base *)0x0);
    }
    bVar6 = (_Rb_tree_header *)setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left
            == &setBlkDataFiles._M_t._M_impl.super__Rb_tree_header;
    if (!bVar6) {
      p_Var8 = setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        pos.nFile = p_Var8[1]._M_color;
        pos.nPos = 0;
        OpenBlockFile((AutoFile *)&criticalblock9,this,&pos,true);
        pmVar5 = criticalblock9.super_unique_lock._M_device;
        AutoFile::~AutoFile((AutoFile *)&criticalblock9);
        if (pmVar5 == (mutex_type *)0x0) goto LAB_0092520b;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        bVar6 = (_Rb_tree_header *)p_Var8 == &setBlkDataFiles._M_t._M_impl.super__Rb_tree_header;
      } while (!bVar6);
    }
    criticalblock9.super_unique_lock._M_owns = false;
    criticalblock9.super_unique_lock._M_device = (mutex_type *)this;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock9.super_unique_lock);
    pCVar4 = (this->m_blockfile_info).
             super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar14 = (long)(this->m_blockfile_info).
                   super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pCVar4;
    if (lVar14 != 0) {
      lVar14 = (lVar14 >> 3) * -0x3333333333333333;
      bVar7 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int>._M_engaged;
      iVar2 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int>._M_payload._M_value;
      puVar9 = &pCVar4->nHeightLast;
      uVar11 = 0;
      do {
        bVar12 = iVar2 <= (int)*puVar9 & bVar7;
        (this->m_blockfile_cursors)._M_elems[bVar12].
        super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_payload =
             (_Storage<node::BlockfileCursor,_true>)(uVar11 & 0xffffffff);
        if ((this->m_blockfile_cursors)._M_elems[bVar12].
            super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
            super__Optional_payload_base<node::BlockfileCursor>._M_engaged == false) {
          (this->m_blockfile_cursors)._M_elems[bVar12].
          super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
          super__Optional_payload_base<node::BlockfileCursor>._M_engaged = true;
        }
        uVar11 = uVar11 + 1;
        puVar9 = puVar9 + 10;
      } while (lVar14 + (ulong)(lVar14 == 0) != uVar11);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock9.super_unique_lock);
    this_01 = (this->m_block_tree_db)._M_t.
              super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>.
              _M_t.
              super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
              .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl;
    criticalblock9.super_unique_lock._M_device = (mutex_type *)local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&criticalblock9,"prunedblockfiles","")
    ;
    kernel::BlockTreeDB::ReadFlag(this_01,(string *)&criticalblock9,&this->m_have_pruned);
    if (criticalblock9.super_unique_lock._M_device != (mutex_type *)local_88) {
      operator_delete(criticalblock9.super_unique_lock._M_device,(ulong)(local_88._0_8_ + 1));
    }
    if (this->m_have_pruned == true) {
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_02._M_len = 0x65;
      logging_function_02._M_str = "LoadBlockIndexDB";
      logging_function_02._M_len = 0x10;
      LogPrintFormatInternal<>
                (logging_function_02,source_file_02,0x225,ALL,Info,
                 (ConstevalFormatString<0U>)0xfa0630);
    }
    bVar7 = CDBWrapper::Exists<unsigned_char>
                      (&((this->m_block_tree_db)._M_t.
                         super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                         .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl)->
                        super_CDBWrapper,"Rl\x01");
    if (bVar7) {
      LOCK();
      (this->m_blockfiles_indexed)._M_base._M_i = false;
      UNLOCK();
    }
LAB_0092520b:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&setBlkDataFiles._M_t);
  }
  else {
    bVar6 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool BlockManager::LoadBlockIndexDB(const std::optional<uint256>& snapshot_blockhash)
{
    if (!LoadBlockIndex(snapshot_blockhash)) {
        return false;
    }
    int max_blockfile_num{0};

    // Load block file info
    m_block_tree_db->ReadLastBlockFile(max_blockfile_num);
    m_blockfile_info.resize(max_blockfile_num + 1);
    LogPrintf("%s: last block file = %i\n", __func__, max_blockfile_num);
    for (int nFile = 0; nFile <= max_blockfile_num; nFile++) {
        m_block_tree_db->ReadBlockFileInfo(nFile, m_blockfile_info[nFile]);
    }
    LogPrintf("%s: last block file info: %s\n", __func__, m_blockfile_info[max_blockfile_num].ToString());
    for (int nFile = max_blockfile_num + 1; true; nFile++) {
        CBlockFileInfo info;
        if (m_block_tree_db->ReadBlockFileInfo(nFile, info)) {
            m_blockfile_info.push_back(info);
        } else {
            break;
        }
    }

    // Check presence of blk files
    LogPrintf("Checking all blk files are present...\n");
    std::set<int> setBlkDataFiles;
    for (const auto& [_, block_index] : m_block_index) {
        if (block_index.nStatus & BLOCK_HAVE_DATA) {
            setBlkDataFiles.insert(block_index.nFile);
        }
    }
    for (std::set<int>::iterator it = setBlkDataFiles.begin(); it != setBlkDataFiles.end(); it++) {
        FlatFilePos pos(*it, 0);
        if (OpenBlockFile(pos, true).IsNull()) {
            return false;
        }
    }

    {
        // Initialize the blockfile cursors.
        LOCK(cs_LastBlockFile);
        for (size_t i = 0; i < m_blockfile_info.size(); ++i) {
            const auto last_height_in_file = m_blockfile_info[i].nHeightLast;
            m_blockfile_cursors[BlockfileTypeForHeight(last_height_in_file)] = {static_cast<int>(i), 0};
        }
    }

    // Check whether we have ever pruned block & undo files
    m_block_tree_db->ReadFlag("prunedblockfiles", m_have_pruned);
    if (m_have_pruned) {
        LogPrintf("LoadBlockIndexDB(): Block files have previously been pruned\n");
    }

    // Check whether we need to continue reindexing
    bool fReindexing = false;
    m_block_tree_db->ReadReindexing(fReindexing);
    if (fReindexing) m_blockfiles_indexed = false;

    return true;
}